

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindCommon.cxx
# Opt level: O0

void __thiscall cmFindCommon::AddPathSuffix(cmFindCommon *this,string *arg)

{
  ulong uVar1;
  char *pcVar2;
  string local_90 [32];
  string local_70 [52];
  undefined4 local_3c;
  undefined1 local_38 [8];
  string suffix;
  string *arg_local;
  cmFindCommon *this_local;
  
  suffix.field_2._8_8_ = arg;
  std::__cxx11::string::string((string *)local_38,(string *)arg);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
    if (*pcVar2 == '/') {
      std::__cxx11::string::substr((ulong)local_70,(ulong)local_38);
      std::__cxx11::string::operator=((string *)local_38,local_70);
      std::__cxx11::string::~string(local_70);
    }
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      std::__cxx11::string::size();
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
      if (*pcVar2 == '/') {
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)local_90,(ulong)local_38);
        std::__cxx11::string::operator=((string *)local_38,local_90);
        std::__cxx11::string::~string(local_90);
      }
      uVar1 = std::__cxx11::string::empty();
      if ((uVar1 & 1) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->SearchPathSuffixes,(value_type *)local_38);
        local_3c = 0;
      }
      else {
        local_3c = 1;
      }
    }
    else {
      local_3c = 1;
    }
  }
  else {
    local_3c = 1;
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmFindCommon::AddPathSuffix(std::string const& arg)
{
  std::string suffix = arg;

  // Strip leading and trailing slashes.
  if (suffix.empty()) {
    return;
  }
  if (suffix[0] == '/') {
    suffix = suffix.substr(1);
  }
  if (suffix.empty()) {
    return;
  }
  if (suffix[suffix.size() - 1] == '/') {
    suffix = suffix.substr(0, suffix.size() - 1);
  }
  if (suffix.empty()) {
    return;
  }

  // Store the suffix.
  this->SearchPathSuffixes.push_back(suffix);
}